

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void showWave(int num)

{
  void *pvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  uint in_EDI;
  undefined8 uVar5;
  undefined8 in_XMM1_Qa;
  ALLEGRO_BITMAP *old_target;
  int h;
  int w;
  char text [20];
  ALLEGRO_FONT *myfont;
  ResourceManager *rm;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar6;
  char local_38 [32];
  void *local_18;
  ResourceManager *local_10;
  uint local_4;
  
  local_4 = in_EDI;
  if (waveBitmap != (ALLEGRO_BITMAP *)0x0) {
    stopWave();
  }
  local_10 = ResourceManager::getInstance();
  local_18 = ResourceManager::getData
                       ((ResourceManager *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff7c);
  uVar6 = 0;
  sprintf(local_38,"WAVE %d",(ulong)local_4);
  uVar2 = al_get_text_width(local_18,local_38);
  uVar3 = al_get_font_line_height(local_18);
  waveBitmap = (ALLEGRO_BITMAP *)al_create_bitmap(uVar2,uVar3);
  uVar4 = al_get_target_bitmap();
  al_set_target_bitmap(waveBitmap);
  uVar5 = al_map_rgba(uVar6,uVar6,uVar6);
  al_clear_to_color(uVar5);
  pvVar1 = local_18;
  uVar5 = al_map_rgb(0xff,0xff);
  al_draw_textf(uVar5,in_XMM1_Qa,0,pvVar1,0,"%s",local_38);
  al_set_target_bitmap(uVar4);
  waveAngle = 6.2831855;
  return;
}

Assistant:

void showWave(int num)
{
   if (waveBitmap)
      stopWave();

   ResourceManager& rm = ResourceManager::getInstance();

   ALLEGRO_FONT *myfont = (ALLEGRO_FONT *)rm.getData(RES_LARGEFONT);
   
   char text[20];
   sprintf(text, "WAVE %d", num);

   int w = al_get_text_width(myfont, text);
   int h = al_get_font_line_height(myfont);

   waveBitmap = al_create_bitmap(w, h);
   ALLEGRO_BITMAP *old_target = al_get_target_bitmap();
   al_set_target_bitmap(waveBitmap);
   al_clear_to_color(al_map_rgba(0, 0, 0, 0));
   al_draw_textf(myfont, al_map_rgb(255, 255, 255), 0, 0, 0, "%s", text);
   al_set_target_bitmap(old_target);

   waveAngle = (ALLEGRO_PI*2);
}